

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_asn1_uint64_with_tag(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  CBS bytes;
  CBS local_20;
  
  iVar2 = cbs_get_asn1(cbs,&local_20,tag,1);
  uVar3 = 0;
  if (iVar2 != 0) {
    iVar2 = CBS_is_unsigned_asn1_integer(&local_20);
    if (iVar2 != 0) {
      *out = 0;
      if (local_20.len == 0) {
        uVar3 = 1;
      }
      else {
        uVar4 = 0;
        uVar6 = 0;
        do {
          *out = uVar4 << 8;
          uVar7 = (ulong)local_20.data[uVar6] | uVar4 << 8;
          *out = uVar7;
          uVar1 = uVar6 + 1;
          if (local_20.len - 1 == uVar6) break;
          uVar5 = uVar4 >> 0x30;
          uVar4 = uVar7;
          uVar6 = uVar1;
        } while (uVar5 == 0);
        uVar3 = (uint)(local_20.len <= uVar1);
      }
    }
  }
  return uVar3;
}

Assistant:

int CBS_get_asn1_uint64_with_tag(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag) {
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_unsigned_asn1_integer(&bytes)) {
    return 0;
  }

  *out = 0;
  const uint8_t *data = CBS_data(&bytes);
  size_t len = CBS_len(&bytes);
  for (size_t i = 0; i < len; i++) {
    if ((*out >> 56) != 0) {
      // Too large to represent as a uint64_t.
      return 0;
    }
    *out <<= 8;
    *out |= data[i];
  }

  return 1;
}